

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

TrodesMsg * new_TrodesMsg(TrodesMsg *__return_storage_ptr__,str *f,list *l)

{
  char cVar1;
  result_type head;
  result_type head_00;
  result_type head_01;
  result_type head_02;
  int iVar2;
  result_type pbVar3;
  result_type head_03;
  result_type __x;
  string *f_00;
  string a;
  string format;
  object_base local_1e0;
  proxy<boost::python::api::item_policies> local_1d8;
  string local_1c8;
  long local_1a8;
  int local_1a0;
  extract_rvalue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  string local_148;
  string local_128;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  TrodesMsg::TrodesMsg(__return_storage_ptr__);
  boost::python::
  extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::extract
            ((extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_188,(object *)f);
  pbVar3 = boost::python::converter::
           extract_rvalue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator()(&local_188);
  std::__cxx11::string::string((string *)&local_1a8,(string *)pbVar3);
  boost::python::converter::
  rvalue_from_python_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~rvalue_from_python_data(&local_188.m_data);
  iVar2 = 0;
  do {
    if (local_1a0 <= iVar2) {
      std::__cxx11::string::~string((string *)&local_1a8);
      return __return_storage_ptr__;
    }
    cVar1 = *(char *)(local_1a8 + iVar2);
    switch(cVar1) {
    case '1':
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)&local_1c8,(int *)l);
      boost::python::api::proxy::operator_cast_to_object((proxy *)&local_1d8);
      boost::python::converter::extract_rvalue<unsigned_char>::extract_rvalue
                ((extract_rvalue<unsigned_char> *)&local_188,
                 (PyObject *)local_1d8.m_target.super_object_base.m_ptr);
      head = boost::python::converter::extract_rvalue<unsigned_char>::operator()
                       ((extract_rvalue<unsigned_char> *)&local_188);
      boost::python::api::object_base::~object_base((object_base *)&local_1d8);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)&local_1c8);
      f_00 = &local_70;
      std::__cxx11::string::string((string *)f_00,"1",(allocator *)&local_188);
      TrodesMsg::addcontents<unsigned_char>(__return_storage_ptr__,f_00,head);
      break;
    case '2':
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)&local_1c8,(int *)l);
      boost::python::api::proxy::operator_cast_to_object((proxy *)&local_1d8);
      boost::python::converter::extract_rvalue<unsigned_short>::extract_rvalue
                ((extract_rvalue<unsigned_short> *)&local_188,
                 (PyObject *)local_1d8.m_target.super_object_base.m_ptr);
      head_00 = boost::python::converter::extract_rvalue<unsigned_short>::operator()
                          ((extract_rvalue<unsigned_short> *)&local_188);
      boost::python::api::object_base::~object_base((object_base *)&local_1d8);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)&local_1c8);
      f_00 = &local_90;
      std::__cxx11::string::string((string *)f_00,"2",(allocator *)&local_188);
      TrodesMsg::addcontents<unsigned_short>(__return_storage_ptr__,f_00,head_00);
      break;
    case '3':
    case '5':
    case '6':
    case '7':
      goto switchD_00266f96_caseD_33;
    case '4':
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)&local_1c8,(int *)l);
      boost::python::api::proxy::operator_cast_to_object((proxy *)&local_1d8);
      boost::python::converter::extract_rvalue<unsigned_int>::extract_rvalue
                ((extract_rvalue<unsigned_int> *)&local_188,
                 (PyObject *)local_1d8.m_target.super_object_base.m_ptr);
      head_02 = boost::python::converter::extract_rvalue<unsigned_int>::operator()
                          ((extract_rvalue<unsigned_int> *)&local_188);
      boost::python::api::object_base::~object_base((object_base *)&local_1d8);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)&local_1c8);
      f_00 = &local_b0;
      std::__cxx11::string::string((string *)f_00,"4",(allocator *)&local_188);
      TrodesMsg::addcontents<unsigned_int>(__return_storage_ptr__,f_00,head_02);
      break;
    case '8':
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)&local_1c8,(int *)l);
      boost::python::api::proxy::operator_cast_to_object((proxy *)&local_1d8);
      boost::python::converter::extract_rvalue<unsigned_long>::extract_rvalue
                ((extract_rvalue<unsigned_long> *)&local_188,
                 (PyObject *)local_1d8.m_target.super_object_base.m_ptr);
      head_03 = boost::python::converter::extract_rvalue<unsigned_long>::operator()
                          ((extract_rvalue<unsigned_long> *)&local_188);
      boost::python::api::object_base::~object_base((object_base *)&local_1d8);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)&local_1c8);
      f_00 = &local_d0;
      std::__cxx11::string::string((string *)f_00,"8",(allocator *)&local_188);
      TrodesMsg::addcontents<unsigned_long>(__return_storage_ptr__,f_00,head_03);
      break;
    default:
      if (cVar1 != 'b') {
        if (cVar1 == 's') {
          boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                    ((object_operators<boost::python::api::object> *)&local_1d8,(int *)l);
          boost::python::api::proxy::operator_cast_to_object((proxy *)&local_1e0);
          boost::python::converter::
          extract_rvalue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::extract_rvalue(&local_188,local_1e0.m_ptr);
          pbVar3 = boost::python::converter::
                   extract_rvalue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator()(&local_188);
          std::__cxx11::string::string((string *)&local_1c8,(string *)pbVar3);
          boost::python::converter::
          rvalue_from_python_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~rvalue_from_python_data(&local_188.m_data);
          boost::python::api::object_base::~object_base(&local_1e0);
          boost::python::api::proxy<boost::python::api::item_policies>::~proxy(&local_1d8);
          std::__cxx11::string::string((string *)&local_128,"s",(allocator *)&local_188);
          std::__cxx11::string::string((string *)&local_f0,(string *)&local_1c8);
          TrodesMsg::addcontents<std::__cxx11::string>(__return_storage_ptr__,&local_128,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_128);
          f_00 = &local_1c8;
        }
        else {
          if (cVar1 != 'i') goto switchD_00266f96_caseD_33;
          boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                    ((object_operators<boost::python::api::object> *)&local_1c8,(int *)l);
          boost::python::api::proxy::operator_cast_to_object((proxy *)&local_1d8);
          boost::python::converter::extract_rvalue<int>::extract_rvalue
                    ((extract_rvalue<int> *)&local_188,
                     (PyObject *)local_1d8.m_target.super_object_base.m_ptr);
          head_01 = boost::python::converter::extract_rvalue<int>::operator()
                              ((extract_rvalue<int> *)&local_188);
          boost::python::api::object_base::~object_base((object_base *)&local_1d8);
          boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                    ((proxy<boost::python::api::item_policies> *)&local_1c8);
          f_00 = &local_50;
          std::__cxx11::string::string((string *)f_00,"i",(allocator *)&local_188);
          TrodesMsg::addcontents<int>(__return_storage_ptr__,f_00,head_01);
        }
        break;
      }
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)&local_1d8,(int *)l);
      boost::python::api::proxy::operator_cast_to_object((proxy *)&local_1e0);
      boost::python::converter::
      extract_rvalue<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::extract_rvalue
                ((extract_rvalue<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 &local_188,local_1e0.m_ptr);
      __x = boost::python::converter::
            extract_rvalue<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator()
                      ((extract_rvalue<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_188);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,__x);
      boost::python::converter::
      rvalue_from_python_data<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      ~rvalue_from_python_data
                ((rvalue_from_python_data<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_188.m_data);
      boost::python::api::object_base::~object_base(&local_1e0);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy(&local_1d8);
      std::__cxx11::string::string((string *)&local_148,"b",(allocator *)&local_188);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
      TrodesMsg::addcontents<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (__return_storage_ptr__,&local_148,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_108);
      std::__cxx11::string::~string((string *)&local_148);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
      goto switchD_00266f96_caseD_33;
    }
    std::__cxx11::string::~string((string *)f_00);
switchD_00266f96_caseD_33:
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

TrodesMsg new_TrodesMsg(str f, list& l){
    TrodesMsg msg;
    std::string format = extract<std::string>(f);
    int strl = format.length();
    for(int i = 0; i < strl; i++){
        switch (format[i]){
        case 'i':{
            int a = extract<int>(l[i]);
            msg.addcontents("i", a);
            break;}
        case '1':{
            uint8_t a = extract<uint8_t>(l[i]);
            msg.addcontents("1", a);
            break;}
        case '2':{
            uint16_t a = extract<uint16_t>(l[i]);
            msg.addcontents("2", a);
            break;}
        case '4':{
            uint32_t a = extract<uint32_t>(l[i]);
            msg.addcontents("4", a);
            break;}
        case '8':{
            uint64_t a = extract<uint64_t>(l[i]);
            msg.addcontents("8", a);
            break;}
        case 's':{
            std::string a = extract<std::string>(l[i]);
            msg.addcontents("s", a);
            break;}
        case 'b':{
            std::vector<byte> a = extract<std::vector<byte> >(l[i]);
            msg.addcontents("b", a);
            break;}
//            case 'n':{
//                NetworkDataType a;
//                msg.popcontents("n", a);
//                l.append(a);
//                break;}
        default:
            break;
        }
    }
    return msg;
}